

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O2

void xPredIntraAngAdi_XY_16(pel *pSrc,pel *dst,int i_dst,int uiDirMode,int iWidth,int iHeight)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  ulong uVar10;
  pel first_line [192];
  
  iVar5 = (int)((long)iHeight / 2);
  uVar6 = iVar5 - 1;
  uVar7 = iVar5 + iWidth + 0xeU & 0xfffffff0;
  pbVar9 = pSrc + -(long)(iHeight + -2);
  uVar10 = 0;
  uVar8 = 0;
  if (0 < (int)uVar6) {
    uVar8 = (ulong)uVar6;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    bVar2 = *pbVar9;
    bVar3 = pbVar9[1];
    first_line[uVar10] = (pel)((uint)pbVar9[2] + (uint)bVar2 + (uint)bVar3 * 2 + 2 >> 2);
    pbVar1 = pbVar9 + -1;
    pbVar9 = pbVar9 + 2;
    first_line[uVar10 + (long)(int)uVar7] =
         (pel)((uint)bVar3 + (uint)bVar2 * 2 + (uint)*pbVar1 + 2 >> 2);
  }
  for (; (long)uVar8 < (long)(iVar5 + iWidth + -1); uVar8 = uVar8 + 1) {
    bVar2 = pbVar9[-1];
    bVar3 = *pbVar9;
    bVar4 = pbVar9[1];
    pbVar1 = pbVar9 + 2;
    pbVar9 = pbVar9 + 1;
    first_line[uVar8] =
         (pel)((uint)*pbVar1 + (uint)bVar2 + ((uint)bVar4 + (uint)bVar3) * 3 + 4 >> 3);
    first_line[uVar8 + (long)(int)uVar7] =
         (pel)((uint)bVar2 + (uint)bVar3 * 2 + (uint)bVar4 + 2 >> 2);
  }
  uVar10 = 0;
  uVar8 = (long)iHeight / 2 & 0xffffffff;
  if (iVar5 < 1) {
    uVar8 = uVar10;
  }
  for (; -uVar10 != uVar8; uVar10 = uVar10 - 1) {
    memcpy(dst,first_line + uVar10 + (long)(int)uVar6,(long)iWidth);
    memcpy(dst + i_dst,first_line + uVar10 + (long)(int)uVar6 + (long)(int)uVar7,(long)iWidth);
    dst = dst + i_dst * 2;
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_XY_16(pel *pSrc, pel *dst, int i_dst, int uiDirMode, int iWidth, int iHeight)
{
    ALIGNED_16(pel first_line[2 * (64 + 32)]);
    int line_size = iWidth + iHeight / 2 - 1;
    int left_size = line_size - iWidth;
    int aligned_line_size = ((line_size + 15) >> 4) << 4;
    pel *pfirst[2] = { first_line, first_line + aligned_line_size };

    int i;

    pSrc -= iHeight - 2;

    for (i = 0; i < left_size; i++, pSrc += 2) {
        pfirst[0][i] = (pSrc[0] + pSrc[1] * 2 + pSrc[2] + 2) >> 2;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    for (; i < line_size; i++, pSrc++) {
        pfirst[0][i] = (pSrc[-1] + (pSrc[0] + pSrc[1]) * 3 + pSrc[2] + 4) >> 3;
        pfirst[1][i] = (pSrc[-1] + pSrc[0] * 2 + pSrc[1] + 2) >> 2;
    }

    pfirst[0] += left_size;
    pfirst[1] += left_size;

    iHeight /= 2;

    for (i = 0; i < iHeight; i++) {
        memcpy(dst, pfirst[0] - i, iWidth * sizeof(pel));
        memcpy(dst + i_dst, pfirst[1] - i, iWidth * sizeof(pel));
        dst += 2 * i_dst;
    }
}